

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O2

string * __thiscall
RegistryValue::DwordAsString_abi_cxx11_(string *__return_storage_ptr__,RegistryValue *this)

{
  uint *puVar1;
  uint *puVar2;
  string *__return_storage_ptr___00;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->m_dwType == 4) {
    puVar1 = (uint *)(this->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar2 = (uint *)(this->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if ((long)puVar2 - (long)puVar1 == 4) {
      stringformat_abi_cxx11_(__return_storage_ptr__,"dword:%08lx",(ulong)*puVar1);
    }
    else if (puVar2 == puVar1) {
      stringformat_abi_cxx11_(__return_storage_ptr__,"dword:");
    }
    else {
      stringformat_abi_cxx11_(&local_78,"DwordAsString: invalid sized dword: %d");
      warn(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      stringformat_abi_cxx11_(&local_78,"hex(%d):",(ulong)this->m_dwType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_79);
      ascdump<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_38,&this->m_data,&local_58,false);
      std::operator+(__return_storage_ptr__,&local_78,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (string *)__cxa_allocate_exception(0x20);
  stringformat_abi_cxx11_
            (__return_storage_ptr___00,"DwordAsString: not a dword: %d",(ulong)this->m_dwType);
  __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
              std::__cxx11::string::~string);
}

Assistant:

std::string DwordAsString() const
    {
            if (m_dwType!=REG_DWORD) throw stringformat("DwordAsString: not a dword: %d", m_dwType);
            if (m_data.size()==0)
                    return stringformat("dword:");
            else if (m_data.size()!=sizeof(uint32_t)) {
        warn(stringformat("DwordAsString: invalid sized dword: %d", m_data.size()));
                    return stringformat("hex(%d):", m_dwType)+ascdump(m_data);
            }
            return stringformat("dword:%08lx", get32le(m_data.begin()));
    }